

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O3

bool __thiscall S2Polyline::Intersects(S2Polyline *this,S2Polyline *line)

{
  bool bVar1;
  int iVar2;
  S2Point *pSVar3;
  S2Point *b;
  S2Point *c;
  int k;
  int k_00;
  S2EdgeCrosser crosser;
  S2EdgeCrosser local_c8;
  S2LatLngRect local_58;
  
  if ((0 < this->num_vertices_) && (0 < line->num_vertices_)) {
    GetRectBound((S2LatLngRect *)&local_c8,this);
    GetRectBound(&local_58,line);
    bVar1 = S2LatLngRect::Intersects((S2LatLngRect *)&local_c8,&local_58);
    if ((bVar1) && (1 < this->num_vertices_)) {
      k_00 = 1;
      do {
        pSVar3 = vertex(this,k_00 + -1);
        b = vertex(this,k_00);
        c = vertex(line,0);
        S2EdgeCrosser::S2EdgeCrosser(&local_c8,pSVar3,b,c);
        if (1 < line->num_vertices_) {
          k = 1;
          do {
            pSVar3 = vertex(line,k);
            bVar1 = S2::IsUnitLength(pSVar3);
            if (!bVar1) {
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)&local_58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
                         ,0x108,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_58.lat_.bounds_.c_[0],
                         "Check failed: S2::IsUnitLength(*d) ",0x23);
              abort();
            }
            iVar2 = s2pred::TriageSign(local_c8.a_,local_c8.b_,pSVar3,&local_c8.a_cross_b_);
            if (((iVar2 == 0) || (local_c8.acb_ != -iVar2)) &&
               (local_c8.bda_ = iVar2, iVar2 = S2EdgeCrosser::CrossingSignInternal(&local_c8,pSVar3)
               , pSVar3 = local_c8.c_, -1 < iVar2)) {
              return true;
            }
            local_c8.c_ = pSVar3;
            k = k + 1;
          } while (k < line->num_vertices_);
        }
        k_00 = k_00 + 1;
      } while (k_00 < this->num_vertices_);
    }
  }
  return false;
}

Assistant:

bool S2Polyline::Intersects(const S2Polyline* line) const {
  if (num_vertices() <= 0 || line->num_vertices() <= 0) {
    return false;
  }

  if (!GetRectBound().Intersects(line->GetRectBound())) {
    return false;
  }

  // TODO(ericv): Use S2ShapeIndex here.
  for (int i = 1; i < num_vertices(); ++i) {
    S2EdgeCrosser crosser(
        &vertex(i - 1), &vertex(i), &line->vertex(0));
    for (int j = 1; j < line->num_vertices(); ++j) {
      if (crosser.CrossingSign(&line->vertex(j)) >= 0) {
        return true;
      }
    }
  }
  return false;
}